

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QMimeTypeXMLData * __thiscall
QHash<QString,_QMimeTypeXMLData>::value(QHash<QString,_QMimeTypeXMLData> *this,QString *key)

{
  QMimeTypeXMLData *pQVar1;
  QMimeTypeXMLData *in_RDI;
  QMimeTypeXMLData *v;
  QMimeTypeXMLData *in_stack_ffffffffffffffc8;
  QMimeTypeXMLData *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QString>((QHash<QString,_QMimeTypeXMLData> *)in_RDI,(QString *)in_RDI);
  if (pQVar1 == (QMimeTypeXMLData *)0x0) {
    memset(in_RDI,0,0x70);
    QMimeTypeXMLData::QMimeTypeXMLData(in_RDI);
  }
  else {
    QMimeTypeXMLData::QMimeTypeXMLData(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }